

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  int target;
  int iVar1;
  int r2;
  int r1;
  int *pReg_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  target = sqlite3GetTempReg(pParse);
  iVar1 = sqlite3ExprCodeTarget(pParse,pExpr,target);
  if (iVar1 == target) {
    *pReg = target;
  }
  else {
    sqlite3ReleaseTempReg(pParse,target);
    *pReg = 0;
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r1 = sqlite3GetTempReg(pParse);
  int r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
  if( r2==r1 ){
    *pReg = r1;
  }else{
    sqlite3ReleaseTempReg(pParse, r1);
    *pReg = 0;
  }
  return r2;
}